

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int base64_decode(char *in_buf,uint in_size,void *out_buf,uint out_size,BASE64_OPTIONS *options)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  BASE64_OPTIONS *pBVar14;
  uint8_t table [256];
  byte abStack_128 [256];
  
  pBVar14 = &base64_def_options;
  if (options != (BASE64_OPTIONS *)0x0) {
    pBVar14 = options;
  }
  if ((((in_size & 3) == 0) && (in_size != 0)) && (cVar1 = pBVar14->pad, cVar1 != '\0')) {
    if (in_buf[in_size - 1] == cVar1) {
      in_size = in_size - 1;
    }
    if (in_buf[in_size - 1] == cVar1) {
      in_size = in_size - 1;
    }
  }
  memset(abStack_128,0xff,0x100);
  lVar6 = 0;
  do {
    abStack_128["ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"[lVar6]] =
         (byte)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x3e);
  abStack_128[pBVar14->ch62] = 0x3e;
  abStack_128[pBVar14->ch63] = 0x3f;
  if (in_size != 0) {
    lVar6 = 0;
    do {
      if (abStack_128[in_buf[lVar6]] == 0xff) {
        return -0x16;
      }
      lVar6 = lVar6 + 1;
    } while (in_size != (uint)lVar6);
  }
  uVar10 = (in_size >> 2) * 3;
  uVar5 = 0xffffffea;
  switch(in_size & 3) {
  case 1:
    goto switchD_00104cfb_caseD_1;
  case 2:
    if ((abStack_128[in_buf[in_size - 1]] & 0x4f) != 0) {
      return -0x16;
    }
    uVar10 = uVar10 + 1;
    break;
  case 3:
    if ((abStack_128[in_buf[in_size - 1]] & 0xc3) != 0) {
      return -0x16;
    }
    uVar10 = uVar10 + 2;
  }
  uVar5 = uVar10;
  if ((out_buf != (void *)0x0) && (bVar4 = uVar5 <= out_size, uVar5 = 0xffffff97, bVar4)) {
    uVar11 = 0;
    uVar7 = 0;
    if (3 < in_size) {
      uVar7 = 0;
      uVar9 = 0;
      do {
        bVar8 = abStack_128[in_buf[uVar9 + 1]];
        bVar2 = abStack_128[in_buf[uVar9 + 2]];
        bVar3 = abStack_128[in_buf[uVar9 + 3]];
        *(byte *)((long)out_buf + uVar7) =
             (byte)(((uint)abStack_128[in_buf[uVar9]] << 0x12) >> 0x10) |
             (byte)(((uint)bVar8 << 0xc) >> 0x10);
        *(byte *)((long)out_buf + uVar7 + 1) =
             (byte)(((uint)bVar8 << 0xc) >> 8) | (byte)(((ulong)bVar2 << 6) >> 8);
        *(byte *)((long)out_buf + uVar7 + 2) = (byte)((ulong)bVar2 << 6) | bVar3;
        uVar7 = uVar7 + 3;
        uVar11 = uVar9 + 4;
        uVar13 = uVar9 + 8;
        uVar9 = uVar11;
      } while (uVar13 <= in_size);
    }
    uVar9 = uVar11 & 0xffffffff;
    uVar5 = (uint)uVar7;
    if ((uint)(uVar9 | 2) == in_size) {
      bVar8 = (byte)(((uint)abStack_128[in_buf[uVar9 + 1]] << 0xc) >> 0x10) |
              (byte)(((uint)abStack_128[in_buf[uVar9]] << 0x12) >> 0x10);
      iVar12 = 1;
      uVar10 = uVar5;
    }
    else {
      if (((uint)uVar11 | 3) != in_size) {
        return uVar5;
      }
      bVar8 = (byte)(((uint)abStack_128[in_buf[uVar9 | 2]] << 6) >> 8) |
              (byte)(((uint)abStack_128[in_buf[uVar9 + 1]] << 0xc) >> 8);
      uVar10 = uVar5 + 1;
      *(byte *)((long)out_buf + (uVar7 & 0xffffffff)) =
           (byte)(((uint)abStack_128[in_buf[uVar9]] << 0x12) >> 0x10) |
           (byte)(((uint)abStack_128[in_buf[uVar9 + 1]] << 0xc) >> 0x10);
      iVar12 = 2;
    }
    uVar5 = uVar5 + iVar12;
    *(byte *)((long)out_buf + (ulong)uVar10) = bVar8;
  }
switchD_00104cfb_caseD_1:
  return uVar5;
}

Assistant:

int
base64_decode(const char* in_buf, unsigned in_size,
              void* out_buf, unsigned out_size,
              const BASE64_OPTIONS* options)
{
    uint8_t table[256];
    int i;
    const char* in = in_buf;
    uint8_t* out = (uint8_t*) out_buf;
    unsigned out_size_needed;
    unsigned in_off = 0;
    unsigned out_off = 0;
    unsigned v;

    if(options == NULL)
        options = &base64_def_options;

    /* Ignore any padding. */
    if(options->pad != '\0'  &&  in_size > 0  &&  in_size % 4 == 0) {
        /* Valid Base64 can have up to two characters of padding. */
        if(in_buf[in_size - 1] == options->pad)
            in_size--;
        if(in_buf[in_size - 1] == options->pad)
            in_size--;
    }

    /* Build table. */
    memset(table, 0xff, 256);
    for(i = 0; i < 62; i++)
        table[(int) base64_table_core[i]] = i;
    table[(int) options->ch62] = 62;
    table[(int) options->ch63] = 63;

    /* Validate the input. */
    for(in_off = 0; in_off < in_size; in_off++) {
        if(table[(int) in[in_off]] == 0xff)
            return -EINVAL;
    }

    /* Every four characters are decoded into 3 bytes of output.
     * Note that on the end only certain values may appear from encoding
     * a tail of one or two bytes in base64_encode(). */
    out_size_needed = (in_size / 4) * 3;
    switch(in_size % 4) {
        case 0:
            break;
        case 1:
            return -EINVAL;
            break;

        case 2:
            if(table[(int) in[in_size-1]] & 0x4f)
                return -EINVAL;
            out_size_needed += 1;
            break;

        case 3:
            if(table[(int) in[in_size-1]] & 0xc3)
                return -EINVAL;
            out_size_needed += 2;
            break;
    }

    if(out_buf == NULL)
        return out_size_needed;

    /* Check we have enough space in the output. */
    if(out_size < out_size_needed)
        return -ENOBUFS;

    /* Main loop. */
    in_off = 0;
    while(in_off + 4 <= in_size) {
        v  = (unsigned)table[(int) in[in_off++]] << 18;
        v |= (unsigned)table[(int) in[in_off++]] << 12;
        v |= (unsigned)table[(int) in[in_off++]] << 6;
        v |= (unsigned)table[(int) in[in_off++]];

        out[out_off++] = (v >> 16) & 0xff;
        out[out_off++] = (v >>  8) & 0xff;
        out[out_off++] = (v      ) & 0xff;
    }

    if(in_off + 2 == in_size) {
        v  = (unsigned)table[(int) in[in_off++]] << 18;
        v |= (unsigned)table[(int) in[in_off++]] << 12;
        out[out_off++] = (v >> 16) & 0xff;
    } else if(in_off + 3 == in_size) {
        v  = (unsigned)table[(int) in[in_off++]] << 18;
        v |= (unsigned)table[(int) in[in_off++]] << 12;
        v |= (unsigned)table[(int) in[in_off++]] << 6;
        out[out_off++] = (v >> 16) & 0xff;
        out[out_off++] = (v >>  8) & 0xff;
    }

    return out_off;
}